

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_f36145::TargetCompileFeaturesImpl::HandleMissingTarget
          (TargetCompileFeaturesImpl *this,string *name)

{
  cmMakefile *this_00;
  string local_38;
  string *local_18;
  string *name_local;
  TargetCompileFeaturesImpl *this_local;
  
  this_00 = (this->super_cmTargetPropCommandBase).Makefile;
  local_18 = name;
  name_local = (string *)this;
  cmStrCat<char_const(&)[45],std::__cxx11::string_const&,char_const(&)[38]>
            (&local_38,(char (*) [45])"Cannot specify compile features for target \"",name,
             (char (*) [38])"\" which is not built by this project.");
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void HandleMissingTarget(const std::string& name) override
  {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot specify compile features for target \"", name,
               "\" which is not built by this project."));
  }